

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_gui.c
# Opt level: O0

void pdgui_stub_vnew(t_pd *owner,char *destination,void *key,char *fmt,...)

{
  char in_AL;
  t_gfxstub *x_00;
  t_symbol *s_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_58 [8];
  va_list args;
  t_gfxstub *local_38;
  t_gfxstub *x;
  t_symbol *s;
  char *fmt_local;
  void *key_local;
  char *destination_local;
  t_pd *owner_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_e8 = in_R8;
  local_e0 = in_R9;
  for (local_38 = gfxstub_list; local_38 != (t_gfxstub *)0x0; local_38 = local_38->x_next) {
    if (local_38->x_key == key) {
      gfxstub_deleteforkey(key);
    }
  }
  x_00 = (t_gfxstub *)pd_new(gfxstub_class);
  s_00 = gfxstub_symbol(x_00);
  pd_bind((t_pd *)x_00,s_00);
  x_00->x_owner = owner;
  x_00->x_sym = s_00;
  x_00->x_key = key;
  x_00->x_next = gfxstub_list;
  gfxstub_list = x_00;
  _pdguistub_vamess(destination,"s",s_00->s_name);
  args[0].overflow_arg_area = local_108;
  args[0]._0_8_ = &stack0x00000008;
  local_58._4_4_ = 0x30;
  local_58._0_4_ = 0x20;
  pdgui_vamess((char *)0x0,fmt,(__va_list_tag *)local_58);
  pdgui_endmess();
  return;
}

Assistant:

void pdgui_stub_vnew(t_pd *owner, const char* destination, void *key, const char* fmt, ...)
{
    t_symbol*s;
    t_gfxstub *x;
    va_list args;

        /* if any exists with matching key, burn it. */
    for (x = gfxstub_list; x; x = x->x_next)
        if (x->x_key == key)
            gfxstub_deleteforkey(key);
    x = (t_gfxstub *)pd_new(gfxstub_class);
    s = gfxstub_symbol(x);
    pd_bind(&x->x_pd, s);
    x->x_owner = owner;
    x->x_sym = s;
    x->x_key = key;
    x->x_next = gfxstub_list;
    gfxstub_list = x;

    _pdguistub_vamess(destination, "s", s->s_name);
    va_start(args, fmt);
    pdgui_vamess(0, fmt, args);
    va_end(args);
    pdgui_endmess();


}